

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntestc.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  int code;
  int iVar2;
  Boolean BVar3;
  Integer in_RSI;
  undefined4 in_EDI;
  int nproc;
  int me;
  Integer stack;
  Integer heap;
  char *str;
  Integer nominal_heap;
  undefined4 uVar4;
  
  uVar4 = 0;
  nominal_heap = 300000;
  str = (char *)0x493e0;
  MPI_Init(&stack0xfffffffffffffff8,&stack0xfffffffffffffff0);
  GA_Initialize();
  uVar1 = GA_Nnodes();
  code = GA_Nodeid();
  if (code == 0) {
    printf("Using %d processes\n\n",(ulong)uVar1);
  }
  BVar3 = MA_init(CONCAT44(uVar4,in_EDI),in_RSI,nominal_heap);
  if (BVar3 == 0) {
    GA_Error(str,code);
  }
  iVar2 = GA_Uses_fapi();
  if (iVar2 != 0) {
    GA_Error(str,code);
  }
  do_work();
  if (code == 0) {
    printf("\nAll tests successful\n\n");
  }
  GA_Terminate();
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
Integer heap=300000, stack=300000;
int me, nproc;

    MP_INIT(argc,argv);

    GA_INIT(argc,argv);                           /* initialize GA */

    nproc = GA_Nnodes();
    me = GA_Nodeid();

    if(me==0) printf("Using %d processes\n\n",nproc);

    if(!MA_init((Integer)MT_F_DBL, stack/nproc, heap/nproc))
       GA_Error("MA_init failed bytes= %d",stack+heap);   

    if(GA_Uses_fapi())GA_Error("Program runs with C API only",1);
    
    do_work();

    if(me==0)printf("\nAll tests successful\n\n");
    GA_Terminate();

    MP_FINALIZE();

    return 0;
}